

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hpp
# Opt level: O0

Color32 __thiscall plot::Color::color32(Color *this,uint8_t white,uint8_t opaque)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  uint8_t opaque_local;
  uint8_t white_local;
  Color *this_local;
  
  fVar5 = utils::clamp<float>(this->r,0.0,1.0);
  lVar1 = std::lround((double)CONCAT44(extraout_XMM0_Db,fVar5 * (float)white));
  fVar5 = utils::clamp<float>(this->g,0.0,1.0);
  lVar2 = std::lround((double)CONCAT44(extraout_XMM0_Db_00,fVar5 * (float)white));
  fVar5 = utils::clamp<float>(this->b,0.0,1.0);
  lVar3 = std::lround((double)CONCAT44(extraout_XMM0_Db_01,fVar5 * (float)white));
  fVar5 = utils::clamp<float>(this->a,0.0,1.0);
  lVar4 = std::lround((double)CONCAT44(extraout_XMM0_Db_02,fVar5 * (float)opaque));
  this_local._4_4_ =
       (Color32)CONCAT13((uint8_t)lVar4,CONCAT12((char)lVar3,CONCAT11((char)lVar2,(char)lVar1)));
  return this_local._4_4_;
}

Assistant:

Color32 color32(std::uint8_t white = 255, std::uint8_t opaque = 255) const {
        using utils::clamp;
        return {
            std::uint8_t(std::lround(clamp(r, 0.0f, 1.0f)*white)),
            std::uint8_t(std::lround(clamp(g, 0.0f, 1.0f)*white)),
            std::uint8_t(std::lround(clamp(b, 0.0f, 1.0f)*white)),
            std::uint8_t(std::lround(clamp(a, 0.0f, 1.0f)*opaque))
        };
    }